

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O3

void Kernel::Clause::operator_delete(void *ptr,uint length)

{
  ulong uVar1;
  
  if (ptr != (void *)0x0) {
    uVar1 = (ulong)length * 8 + 0x7f & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      *(undefined8 *)ptr = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ptr;
      return;
    }
    if (uVar1 < 0x11) {
      *(undefined8 *)ptr = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ptr;
      return;
    }
    if (uVar1 < 0x19) {
      *(undefined8 *)ptr = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ptr;
      return;
    }
    if (uVar1 < 0x21) {
      *(undefined8 *)ptr = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ptr;
      return;
    }
    if (uVar1 < 0x31) {
      *(undefined8 *)ptr = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ptr;
      return;
    }
    if (0x40 < uVar1) {
      ::operator_delete(ptr,0x10);
      return;
    }
    *(undefined8 *)ptr = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ptr;
  }
  return;
}

Assistant:

inline void free(void *pointer, size_t size, size_t align) {
    ASS_EQ(size % align, 0)

    if(!pointer)
      return;

    if(size <= 1 * sizeof(void *))
      return FSA1.free(pointer);
    if(size <= 2 * sizeof(void *))
      return FSA2.free(pointer);
    if(size <= 3 * sizeof(void *))
      return FSA3.free(pointer);
    if(size <= 4 * sizeof(void *))
      return FSA4.free(pointer);
    if(size <= 6 * sizeof(void *))
      return FSA6.free(pointer);
    if(size <= 8 * sizeof(void *))
      return FSA8.free(pointer);

    ::operator delete(pointer, (std::align_val_t)align);
  }